

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

void cleanup_ghost(void)

{
  param_pair local_18;
  ghost_level *l;
  ghost *g;
  
  for (l = (ghost_level *)ghosts; l != (ghost_level *)0x0; l = l->next) {
    for (local_18 = l->avg_hp; local_18 != (param_pair)0x0; local_18 = *(param_pair *)local_18) {
      if (*(long *)((long)local_18 + 0x38) != 0) {
        string_free(*(char **)((long)local_18 + 0x38));
      }
      if (*(long *)((long)local_18 + 0x40) != 0) {
        string_free(*(char **)((long)local_18 + 0x40));
      }
    }
    string_free(*(char **)&l->level);
  }
  mem_free(ghosts);
  return;
}

Assistant:

static void cleanup_ghost(void)
{
	struct ghost *g;
	for (g = ghosts; g; g = g->next) {
		struct ghost_level *l;
		for (l = g->level; l; l = l->next) {
			if (l->blow_effect1) string_free(l->blow_effect1);
			if (l->blow_effect2) string_free(l->blow_effect2);
		}
		string_free(g->name);
	}
	mem_free(ghosts);
}